

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshifter.cpp
# Opt level: O0

void anon_unknown.dwarf_1421bc::Fshifter_setParami(EffectProps *props,ALenum param,int val)

{
  effect_exception *peVar1;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  
  if (in_ESI == 2) {
    if ((in_EDX < 0) || (2 < in_EDX)) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception
                (peVar1,0xa003,"Frequency shifter left direction out of range");
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    *(int *)(in_RDI + 4) = in_EDX;
  }
  else {
    if (in_ESI != 3) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception
                (peVar1,0xa002,"Invalid frequency shifter integer property 0x%04x",(ulong)in_ESI);
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    if ((in_EDX < 0) || (2 < in_EDX)) {
      peVar1 = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception
                (peVar1,0xa003,"Frequency shifter right direction out of range");
      __cxa_throw(peVar1,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    *(int *)(in_RDI + 8) = in_EDX;
  }
  return;
}

Assistant:

void Fshifter_setParami(EffectProps *props, ALenum param, int val)
{
    switch(param)
    {
    case AL_FREQUENCY_SHIFTER_LEFT_DIRECTION:
        if(!(val >= AL_FREQUENCY_SHIFTER_MIN_LEFT_DIRECTION && val <= AL_FREQUENCY_SHIFTER_MAX_LEFT_DIRECTION))
            throw effect_exception{AL_INVALID_VALUE,
                "Frequency shifter left direction out of range"};
        props->Fshifter.LeftDirection = val;
        break;

    case AL_FREQUENCY_SHIFTER_RIGHT_DIRECTION:
        if(!(val >= AL_FREQUENCY_SHIFTER_MIN_RIGHT_DIRECTION && val <= AL_FREQUENCY_SHIFTER_MAX_RIGHT_DIRECTION))
            throw effect_exception{AL_INVALID_VALUE,
                "Frequency shifter right direction out of range"};
        props->Fshifter.RightDirection = val;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM,
            "Invalid frequency shifter integer property 0x%04x", param};
    }
}